

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int editPage(MemPage *pPg,int iOld,int iNew,int nNew,CellArray *pCArray)

{
  int iVar1;
  int iFirst;
  int iVar2;
  u8 *puVar3;
  int local_80;
  int iCell;
  int nAdd;
  int nTail;
  int nShift;
  int iNewEnd;
  int iOldEnd;
  int i;
  u8 *pCellptr;
  u8 *pData;
  u8 *puStack_48;
  int nCell;
  u8 *pBegin;
  u8 *puStack_38;
  int hdr;
  u8 *aData;
  CellArray *pCArray_local;
  int local_20;
  int nNew_local;
  int iNew_local;
  int iOld_local;
  MemPage *pPg_local;
  
  puStack_38 = pPg->aData;
  pBegin._4_4_ = (uint)pPg->hdrOffset;
  puStack_48 = pPg->aCellIdx + (nNew << 1);
  pData._4_4_ = (uint)pPg->nCell;
  iVar1 = iOld + (uint)pPg->nCell + (uint)pPg->nOverflow;
  iFirst = iNew + nNew;
  aData = (u8 *)pCArray;
  pCArray_local._4_4_ = nNew;
  local_20 = iNew;
  nNew_local = iOld;
  _iNew_local = pPg;
  if (iOld < iNew) {
    iVar2 = pageFreeArray(pPg,iOld,iNew - iOld,pCArray);
    if ((int)pData._4_4_ < iVar2) {
      iVar1 = sqlite3CorruptError(0x12293);
      return iVar1;
    }
    memmove(_iNew_local->aCellIdx,_iNew_local->aCellIdx + (iVar2 << 1),(long)(int)(pData._4_4_ << 1)
           );
    pData._4_4_ = pData._4_4_ - iVar2;
  }
  if (iFirst < iVar1) {
    iVar1 = pageFreeArray(_iNew_local,iFirst,iVar1 - iFirst,(CellArray *)aData);
    pData._4_4_ = pData._4_4_ - iVar1;
  }
  pCellptr = puStack_38 +
             (int)((CONCAT11(puStack_38[(int)(pBegin._4_4_ + 5)],
                             puStack_38[(long)(int)(pBegin._4_4_ + 5) + 1]) - 1 & 0xffff) + 1);
  if ((puStack_48 <= pCellptr) && (pCellptr <= _iNew_local->aDataEnd)) {
    if (local_20 < nNew_local) {
      if (pCArray_local._4_4_ < nNew_local - local_20) {
        local_80 = pCArray_local._4_4_;
      }
      else {
        local_80 = nNew_local - local_20;
      }
      puVar3 = _iNew_local->aCellIdx;
      memmove(puVar3 + (local_80 << 1),puVar3,(long)(int)(pData._4_4_ << 1));
      iVar1 = pageInsertArray(_iNew_local,puStack_48,&pCellptr,puVar3,local_20,local_80,
                              (CellArray *)aData);
      if (iVar1 != 0) goto LAB_0016d3ce;
      pData._4_4_ = local_80 + pData._4_4_;
    }
    for (iNewEnd = 0; iNewEnd < (int)(uint)_iNew_local->nOverflow; iNewEnd = iNewEnd + 1) {
      iVar1 = (nNew_local + (uint)_iNew_local->aiOvfl[iNewEnd]) - local_20;
      if ((-1 < iVar1) && (iVar1 < pCArray_local._4_4_)) {
        puVar3 = _iNew_local->aCellIdx + iVar1 * 2;
        if (iVar1 < (int)pData._4_4_) {
          memmove(puVar3 + 2,puVar3,(long)(int)((pData._4_4_ - iVar1) * 2));
        }
        pData._4_4_ = pData._4_4_ + 1;
        cachedCellSize((CellArray *)aData,iVar1 + local_20);
        iVar1 = pageInsertArray(_iNew_local,puStack_48,&pCellptr,puVar3,iVar1 + local_20,1,
                                (CellArray *)aData);
        if (iVar1 != 0) goto LAB_0016d3ce;
      }
    }
    iVar1 = pageInsertArray(_iNew_local,puStack_48,&pCellptr,
                            _iNew_local->aCellIdx + (int)(pData._4_4_ << 1),local_20 + pData._4_4_,
                            pCArray_local._4_4_ - pData._4_4_,(CellArray *)aData);
    if (iVar1 == 0) {
      _iNew_local->nCell = (u16)pCArray_local._4_4_;
      _iNew_local->nOverflow = '\0';
      puStack_38[(int)(pBegin._4_4_ + 3)] = (u8)(_iNew_local->nCell >> 8);
      puStack_38[(long)(int)(pBegin._4_4_ + 3) + 1] = (u8)_iNew_local->nCell;
      puStack_38[(int)(pBegin._4_4_ + 5)] = (u8)((ulong)((long)pCellptr - (long)puStack_38) >> 8);
      puStack_38[(long)(int)(pBegin._4_4_ + 5) + 1] = (char)pCellptr - (char)puStack_38;
      return 0;
    }
  }
LAB_0016d3ce:
  populateCellCache((CellArray *)aData,local_20,pCArray_local._4_4_);
  iVar1 = rebuildPage((CellArray *)aData,local_20,pCArray_local._4_4_,_iNew_local);
  return iVar1;
}

Assistant:

static int editPage(
  MemPage *pPg,                   /* Edit this page */
  int iOld,                       /* Index of first cell currently on page */
  int iNew,                       /* Index of new first cell on page */
  int nNew,                       /* Final number of cells on page */
  CellArray *pCArray              /* Array of cells and sizes */
){
  u8 * const aData = pPg->aData;
  const int hdr = pPg->hdrOffset;
  u8 *pBegin = &pPg->aCellIdx[nNew * 2];
  int nCell = pPg->nCell;       /* Cells stored on pPg */
  u8 *pData;
  u8 *pCellptr;
  int i;
  int iOldEnd = iOld + pPg->nCell + pPg->nOverflow;
  int iNewEnd = iNew + nNew;

#ifdef SQLITE_DEBUG
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  memcpy(pTmp, aData, pPg->pBt->usableSize);
#endif

  /* Remove cells from the start and end of the page */
  assert( nCell>=0 );
  if( iOld<iNew ){
    int nShift = pageFreeArray(pPg, iOld, iNew-iOld, pCArray);
    if( NEVER(nShift>nCell) ) return SQLITE_CORRUPT_BKPT;
    memmove(pPg->aCellIdx, &pPg->aCellIdx[nShift*2], nCell*2);
    nCell -= nShift;
  }
  if( iNewEnd < iOldEnd ){
    int nTail = pageFreeArray(pPg, iNewEnd, iOldEnd - iNewEnd, pCArray);
    assert( nCell>=nTail );
    nCell -= nTail;
  }

  pData = &aData[get2byteNotZero(&aData[hdr+5])];
  if( pData<pBegin ) goto editpage_fail;
  if( pData>pPg->aDataEnd ) goto editpage_fail;

  /* Add cells to the start of the page */
  if( iNew<iOld ){
    int nAdd = MIN(nNew,iOld-iNew);
    assert( (iOld-iNew)<nNew || nCell==0 || CORRUPT_DB );
    assert( nAdd>=0 );
    pCellptr = pPg->aCellIdx;
    memmove(&pCellptr[nAdd*2], pCellptr, nCell*2);
    if( pageInsertArray(
          pPg, pBegin, &pData, pCellptr,
          iNew, nAdd, pCArray
    ) ) goto editpage_fail;
    nCell += nAdd;
  }

  /* Add any overflow cells */
  for(i=0; i<pPg->nOverflow; i++){
    int iCell = (iOld + pPg->aiOvfl[i]) - iNew;
    if( iCell>=0 && iCell<nNew ){
      pCellptr = &pPg->aCellIdx[iCell * 2];
      if( nCell>iCell ){
        memmove(&pCellptr[2], pCellptr, (nCell - iCell) * 2);
      }
      nCell++;
      cachedCellSize(pCArray, iCell+iNew);
      if( pageInsertArray(
            pPg, pBegin, &pData, pCellptr,
            iCell+iNew, 1, pCArray
      ) ) goto editpage_fail;
    }
  }

  /* Append cells to the end of the page */
  assert( nCell>=0 );
  pCellptr = &pPg->aCellIdx[nCell*2];
  if( pageInsertArray(
        pPg, pBegin, &pData, pCellptr,
        iNew+nCell, nNew-nCell, pCArray
  ) ) goto editpage_fail;

  pPg->nCell = nNew;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);

#ifdef SQLITE_DEBUG
  for(i=0; i<nNew && !CORRUPT_DB; i++){
    u8 *pCell = pCArray->apCell[i+iNew];
    int iOff = get2byteAligned(&pPg->aCellIdx[i*2]);
    if( SQLITE_WITHIN(pCell, aData, &aData[pPg->pBt->usableSize]) ){
      pCell = &pTmp[pCell - aData];
    }
    assert( 0==memcmp(pCell, &aData[iOff],
            pCArray->pRef->xCellSize(pCArray->pRef, pCArray->apCell[i+iNew])) );
  }
#endif

  return SQLITE_OK;
 editpage_fail:
  /* Unable to edit this page. Rebuild it from scratch instead. */
  populateCellCache(pCArray, iNew, nNew);
  return rebuildPage(pCArray, iNew, nNew, pPg);
}